

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_options_win(char *name,wchar_t row)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  wchar_t c;
  wchar_t a;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *s;
  char (*__s) [16];
  int iVar10;
  wchar_t y;
  wchar_t wVar11;
  uint uVar12;
  ulong uVar13;
  ui_event uVar14;
  keypress ch;
  uint32_t new_flags [8];
  uint32_t local_58 [8];
  long local_38;
  
  local_58._16_8_ = window_flag._16_8_;
  local_58._24_8_ = window_flag._24_8_;
  local_58._0_8_ = window_flag._0_8_;
  local_58._8_8_ = window_flag._8_8_;
  screen_save();
  uVar12 = 0;
  clear_from(L'\0');
  uVar4 = 0;
LAB_001fcd55:
  do {
    uVar13 = (ulong)uVar12;
    uVar3 = 1 << ((byte)uVar4 & 0x1f);
    local_38 = (long)(int)uVar12;
    bVar1 = (byte)uVar4 & 0x1f;
LAB_001fcd95:
    do {
      while( true ) {
        prt("Window flags (<dir> to move, \'t\'/Enter to toggle, or ESC)",L'\0',L'\0');
        iVar10 = 0x23;
        __s = angband_term_name;
        uVar8 = 0;
        do {
          wVar11 = L'\x01';
          if (uVar13 == uVar8) {
            wVar11 = L'\x0e';
          }
          sVar6 = strlen(*__s);
          Term_putstr(iVar10 - (int)(sVar6 >> 1),(uint)uVar8 & 1 | 2,L'\xffffffff',wVar11,*__s);
          uVar8 = uVar8 + 1;
          iVar10 = iVar10 + 5;
          __s = __s + 1;
        } while (uVar8 != 8);
        uVar8 = 0;
        do {
          s = window_flag_desc[uVar8];
          wVar11 = L'\x01';
          if (uVar8 == uVar4) {
            wVar11 = L'\x0e';
          }
          if (s == (char *)0x0) {
            s = "(Unused option)";
          }
          y = (int)uVar8 + L'\x05';
          Term_putstr(L'\0',y,L'\xffffffff',wVar11,s);
          wVar11 = L'#';
          uVar9 = 0;
          do {
            a = L'\x01';
            if (uVar13 == uVar9 && uVar8 == uVar4) {
              a = L'\x0e';
            }
            c = L'.';
            if ((local_58[uVar9] & 1 << ((byte)uVar8 & 0x1f)) != 0) {
              c = L'X';
            }
            Term_putch(wVar11,y,a,c);
            uVar9 = uVar9 + 1;
            wVar11 = wVar11 + L'\x05';
          } while (uVar9 != 8);
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x10);
        Term_gotoxy(uVar12 * 5 + L'#',uVar4 + L'\x05');
        uVar14 = inkey_ex();
        uVar8 = uVar14._0_8_;
        uVar5 = uVar14.key.code;
        if (uVar14.type == EVT_KBRD) break;
        if (uVar14.type == EVT_MOUSE) {
          uVar3 = uVar12;
          uVar2 = uVar4;
          if (((((uVar8 & 0xff000000000000) != 0x2000000000000) &&
               (uVar7 = (uVar5 >> 8 & 0xff) - 5, uVar7 < 0x10)) &&
              (uVar5 = uVar5 & 0xff, uVar5 - 0x28 < 0x23)) &&
             (((uVar5 % 5 == 0 && (uVar3 = (int)(uVar5 - 0x23) / 5, uVar2 = uVar7, uVar7 == uVar4))
              && (uVar3 == uVar12)))) {
            uVar3 = local_58[uVar13];
            uVar5 = uVar3 & ~(1 << (uVar4 & 0x1f));
            if ((uVar3 >> (uVar4 & 0x1f) & 1) == 0) {
              uVar5 = uVar3 | 1 << (uVar4 & 0x1f);
            }
            local_58[uVar13] = uVar5;
            uVar3 = uVar12;
            uVar2 = uVar4;
          }
          uVar4 = uVar2;
          uVar12 = uVar3;
          if ((uVar8 & 0xff000000000000) == 0x2000000000000) {
LAB_001fd05c:
            subwindows_set_flags(local_58,8);
            screen_load();
            return;
          }
          goto LAB_001fcd55;
        }
      }
      if ((int)uVar5 < 0x74) {
        if (uVar5 == 0x35) goto LAB_001fcee4;
        if (uVar5 == 0x71) goto LAB_001fd05c;
      }
      else {
        if ((uVar5 == 0x74) || (uVar5 == 0x9c)) {
LAB_001fcee4:
          if (uVar13 == 0) {
            bell();
          }
          else {
            uVar5 = local_58[local_38];
            if ((uVar5 & uVar3) == 0) {
              local_58[local_38] = uVar5 | uVar3;
            }
            else {
              local_58[local_38] = uVar5 & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
            }
          }
          goto LAB_001fcd95;
        }
        if (uVar5 == 0xe000) goto LAB_001fd05c;
      }
      ch._8_4_ = uVar14._8_4_ & 0xff;
      ch.type = (int)uVar8;
      ch.code = (int)(uVar8 >> 0x20);
      wVar11 = target_dir(ch);
    } while (wVar11 == L'\0');
    uVar3 = uVar12 + (int)ddx[wVar11] + 8;
    uVar12 = (int)ddx[wVar11] + uVar12 + 0xf;
    if (-1 < (int)uVar3) {
      uVar12 = uVar3;
    }
    uVar12 = uVar3 - (uVar12 & 0xfffffff8);
    uVar3 = (int)ddy[wVar11] + uVar4 + 0x10;
    uVar4 = uVar4 + (int)ddy[wVar11] + 0x1f;
    if (-1 < (int)uVar3) {
      uVar4 = uVar3;
    }
    uVar4 = uVar3 - (uVar4 & 0xfffffff0);
  } while( true );
}

Assistant:

static void do_cmd_options_win(const char *name, int row)
{
	int i, j, d;
	int y = 0;
	int x = 0;
	ui_event ke;
	uint32_t new_flags[ANGBAND_TERM_MAX];

	/* Set new flags to the old values */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
		new_flags[j] = window_flag[j];

	/* Clear screen */
	screen_save();
	clear_from(0);

	/* Interact */
	while (1) {
		/* Prompt */
		prt("Window flags (<dir> to move, 't'/Enter to toggle, or ESC)", 0, 0);

		/* Display the windows */
		for (j = 0; j < ANGBAND_TERM_MAX; j++) {
			uint8_t a = COLOUR_WHITE;

			const char *s = angband_term_name[j];

			/* Use color */
			if (j == x) a = COLOUR_L_BLUE;

			/* Window name, staggered, centered */
			Term_putstr(35 + j * 5 - strlen(s) / 2, 2 + j % 2, -1, a, s);
		}

		/* Display the options */
		for (i = 0; i < PW_MAX_FLAGS; i++) {
			uint8_t a = COLOUR_WHITE;

			const char *str = window_flag_desc[i];

			/* Use color */
			if (i == y) a = COLOUR_L_BLUE;

			/* Unused option */
			if (!str) str = "(Unused option)";

			/* Flag name */
			Term_putstr(0, i + 5, -1, a, str);

			/* Display the windows */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				wchar_t c = L'.';

				a = COLOUR_WHITE;

				/* Use color */
				if ((i == y) && (j == x)) a = COLOUR_L_BLUE;

				/* Active flag */
				if (new_flags[j] & ((uint32_t) 1 << i)) c = L'X';

				/* Flag value */
				Term_putch(35 + j * 5, i + 5, a, c);
			}
		}

		/* Place Cursor */
		Term_gotoxy(35 + x * 5, y + 5);

		/* Get key */
		ke = inkey_ex();

		/* Mouse or keyboard interaction */
		if (ke.type == EVT_MOUSE) {
			int choicey = ke.mouse.y - 5;
			int choicex = (ke.mouse.x - 35)/5;

			if (ke.mouse.button == 2)
				break;

			if ((choicey >= 0) && (choicey < PW_MAX_FLAGS)
				&& (choicex > 0) && (choicex < ANGBAND_TERM_MAX)
				&& !(ke.mouse.x % 5)) {
				if ((choicey == y) && (choicex == x)) {
					uint32_t flag = ((uint32_t) 1) << y;

					/* Toggle flag (off) */
					if (new_flags[x] & flag)
						new_flags[x] &= ~flag;
					/* Toggle flag (on) */
					else
						new_flags[x] |= flag;
				} else {
					y = choicey;
					x = (ke.mouse.x - 35)/5;
				}
			}
		} else if (ke.type == EVT_KBRD) {
			if (ke.key.code == ESCAPE || ke.key.code == 'q')
				break;

			/* Toggle */
			else if (ke.key.code == '5' || ke.key.code == 't' ||
					ke.key.code == KC_ENTER) {
				/* Hack -- ignore the main window */
				if (x == 0)
					bell();

				/* Toggle flag (off) */
				else if (new_flags[x] & (((uint32_t) 1) << y))
					new_flags[x] &= ~(((uint32_t) 1) << y);

				/* Toggle flag (on) */
				else
					new_flags[x] |= (((uint32_t) 1) << y);

				/* Continue */
				continue;
			}

			/* Extract direction */
			d = target_dir(ke.key);

			/* Move */
			if (d != 0) {
				x = (x + ddx[d] + 8) % ANGBAND_TERM_MAX;
				y = (y + ddy[d] + 16) % PW_MAX_FLAGS;
			}
		}
	}

	/* Notice changes */
	subwindows_set_flags(new_flags, ANGBAND_TERM_MAX);

	screen_load();
}